

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmlLinkedList.c
# Opt level: O2

void rmlLinkedListEach(void *self,rmlLinkedListEachCallback callback,void *attachment)

{
  undefined8 *puVar1;
  _Bool _Var2;
  long lVar3;
  rmlLinkedListEachCallbackContext context;
  rmlLinkedListEachCallbackContext local_48;
  
  if (callback != (rmlLinkedListEachCallback)0x0) {
    lVar3 = 0;
    local_48.attachment = attachment;
    local_48.linkedList = self;
    while (puVar1 = *self, puVar1 != (undefined8 *)0x0) {
      local_48.value = (void *)*puVar1;
      local_48.valueItem = puVar1;
      local_48.index = lVar3;
      _Var2 = (*callback)(&local_48);
      if (_Var2) {
        return;
      }
      lVar3 = lVar3 + 1;
      self = puVar1 + 2;
    }
  }
  return;
}

Assistant:

void rmlLinkedListEach(void *self, rmlLinkedListEachCallback callback, void *attachment) {
    struct rmlLinkedList *selfList = self;
    rmlLinkedListEachCallbackContext context;
    context.linkedList = selfList;
    context.attachment = attachment;
    int64_t index = 0;
    for (struct rmlLinkedListItem *current = selfList->head_; current != NULL; current = current->next_) {
        if (callback == NULL) {
            break;
        }

        context.valueItem = current;
        context.value = current->value_;
        context.index = index;
        if (callback(&context)) {
            break;
        }
        index++;
    }
}